

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O2

void f3(ct22 *a)

{
  ostream *poVar1;
  long lVar2;
  scoped_lock l;
  
  LOCK();
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)
       ((int)success_counter.super___atomic_base<int>._M_i +
       (uint)(0x37 < (int)x.super___atomic_base<int>._M_i));
  UNLOCK();
  inwritemode = true;
  spin_mutex_t::lock(&my_io_mutex);
  poVar1 = std::operator<<((ostream *)&std::cerr,"-------------\nf3 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*a)[0]);
  std::operator<<(poVar1," begin: ");
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  (*a)[0] = (*a)[0] + 1;
  fun(false,600);
  spin_mutex_t::lock(&my_io_mutex);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f3 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*a)[0]);
  std::operator<<(poVar1," end: ");
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  inwritemode = false;
  LOCK();
  x.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)x.super___atomic_base<int>._M_i + -0x38);
  UNLOCK();
  return;
}

Assistant:

void f3(ct22& a)
{ 
  success_counter.fetch_add(x >= (32 + 16 + 8)); //f2, f2b and f2c must have finished
  inwritemode = true;
  LOG("-------------\nf3 " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  a[0]++;
  fun(false);
  LOG("f3 " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  inwritemode = false;
  x.fetch_add(-(32 + 16 + 8));
}